

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O3

int test_monster(flatcc_builder_t *B)

{
  int iVar1;
  void *addr;
  char *pcVar2;
  size_t size;
  size_t local_20;
  
  gen_monster(B,0);
  addr = flatcc_builder_finalize_aligned_buffer(B,&local_20);
  hexdump("monster table",addr,local_20,_stderr);
  iVar1 = flatcc_verify_table_as_root(addr,local_20,"MONS",MyGame_Example_Monster_verify_table);
  if (iVar1 == 0) {
    iVar1 = verify_monster(addr);
    flatcc_builder_aligned_free(addr);
  }
  else {
    pcVar2 = flatcc_verify_error_string(iVar1);
    printf("Monster buffer failed to verify, got: %s\n",pcVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int test_monster(flatcc_builder_t *B)
{
    void *buffer;
    size_t size;
    int ret;

    gen_monster(B, 0);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("monster table", buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(buffer, size)))) {
        printf("Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    ret = verify_monster(buffer);

    flatcc_builder_aligned_free(buffer);
    return ret;
}